

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapic.cc
# Opt level: O3

long __thiscall rapic::header::get_integer(header *this)

{
  int iVar1;
  char *__nptr;
  char *in_RAX;
  int *piVar2;
  long lVar3;
  undefined8 uVar4;
  char *local_28;
  
  __nptr = (this->value_)._M_dataplus._M_p;
  local_28 = in_RAX;
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  *piVar2 = 0;
  lVar3 = strtol(__nptr,&local_28,10);
  if (local_28 == __nptr) {
    uVar4 = std::__throw_invalid_argument("stol");
    if (*piVar2 == 0) {
      *piVar2 = iVar1;
    }
    _Unwind_Resume(uVar4);
  }
  if (*piVar2 != 0) {
    if (*piVar2 != 0x22) {
      return lVar3;
    }
    lVar3 = std::__throw_out_of_range("stol");
  }
  *piVar2 = iVar1;
  return lVar3;
}

Assistant:

scan::scan()
{
  reset();
}